

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ShutdownData::~ShutdownData(ShutdownData *this)

{
  __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
  __last;
  __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
  __first;
  bool bVar1;
  reference ppVar2;
  __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
  *in_RDI;
  pair<void_(*)(const_void_*),_const_void_*> pair;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  *__range3;
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
  local_28 [2];
  pair<void_(*)(const_void_*),_const_void_*> *local_18;
  pair<void_(*)(const_void_*),_const_void_*> *local_10;
  
  local_10 = (pair<void_(*)(const_void_*),_const_void_*> *)
             std::
             vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
             ::begin(in_stack_ffffffffffffffa8);
  local_18 = (pair<void_(*)(const_void_*),_const_void_*> *)
             std::
             vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
             ::end(in_stack_ffffffffffffffa8);
  __first._M_current._4_4_ = in_stack_ffffffffffffffc4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffc0;
  __last._M_current._4_4_ = in_stack_ffffffffffffffbc;
  __last._M_current._0_4_ = in_stack_ffffffffffffffb8;
  std::
  reverse<__gnu_cxx::__normal_iterator<std::pair<void(*)(void_const*),void_const*>*,std::vector<std::pair<void(*)(void_const*),void_const*>,std::allocator<std::pair<void(*)(void_const*),void_const*>>>>>
            (__first,__last);
  local_28[0]._M_current =
       (pair<void_(*)(const_void_*),_const_void_*> *)
       std::
       vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
             ::operator*(local_28);
    in_stack_ffffffffffffffc0 = *(undefined4 *)&ppVar2->second;
    in_stack_ffffffffffffffc4 = *(undefined4 *)((long)&ppVar2->second + 4);
    (*ppVar2->first)(ppVar2->second);
    __gnu_cxx::
    __normal_iterator<std::pair<void_(*)(const_void_*),_const_void_*>_*,_std::vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>_>
    ::operator++(local_28);
  }
  std::
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  ::~vector((vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

~ShutdownData() {
    std::reverse(functions.begin(), functions.end());
    for (auto pair : functions) pair.first(pair.second);
  }